

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseUnresolvedName(State *state)

{
  undefined8 uVar1;
  bool bVar2;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  ParseFunc in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  undefined7 in_stack_ffffffffffffffc0;
  char in_stack_ffffffffffffffc7;
  State *state_00;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard local_18;
  State *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_18,in_RDI);
  bVar2 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_18);
  if (bVar2) {
    local_1 = 0;
  }
  else {
    state_00 = *(State **)&local_10->parse_state;
    uVar1 = *(undefined8 *)&(local_10->parse_state).prev_name_idx;
    bVar2 = ParseTwoCharToken(state_00,(char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                        in_stack_ffffffffffffffc0));
    bVar2 = Optional(bVar2);
    if ((bVar2) && (bVar2 = ParseBaseUnresolvedName(in_stack_ffffffffffffffd8), bVar2)) {
      local_1 = 1;
    }
    else {
      *(State **)&local_10->parse_state = state_00;
      *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar1;
      bVar2 = ParseTwoCharToken(state_00,(char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                          in_stack_ffffffffffffffc0));
      if (((bVar2) &&
          (bVar2 = ParseUnresolvedType((State *)CONCAT17(in_stack_ffffffffffffffa7,
                                                         CONCAT16(in_stack_ffffffffffffffa6,
                                                                  in_stack_ffffffffffffffa0))),
          bVar2)) && (bVar2 = ParseBaseUnresolvedName(in_stack_ffffffffffffffd8), bVar2)) {
        local_1 = 1;
      }
      else {
        *(State **)&local_10->parse_state = state_00;
        *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar1;
        bVar2 = ParseTwoCharToken(state_00,(char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                            in_stack_ffffffffffffffc0));
        if ((((bVar2) && (bVar2 = ParseOneCharToken(state_00,in_stack_ffffffffffffffc7), bVar2)) &&
            ((bVar2 = ParseUnresolvedType((State *)CONCAT17(in_stack_ffffffffffffffa7,
                                                            CONCAT16(in_stack_ffffffffffffffa6,
                                                                     in_stack_ffffffffffffffa0))),
             bVar2 && ((bVar2 = OneOrMore(in_stack_ffffffffffffff98,(State *)0x3b6eab), bVar2 &&
                       (bVar2 = ParseOneCharToken(state_00,in_stack_ffffffffffffffc7), bVar2))))))
           && (bVar2 = ParseBaseUnresolvedName(in_stack_ffffffffffffffd8), bVar2)) {
          local_1 = 1;
        }
        else {
          *(State **)&local_10->parse_state = state_00;
          *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar1;
          bVar2 = ParseTwoCharToken(state_00,(char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                              in_stack_ffffffffffffffc0));
          bVar2 = Optional(bVar2);
          if ((((bVar2) &&
               (bVar2 = ParseTwoCharToken(state_00,(char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                                    in_stack_ffffffffffffffc0)),
               bVar2)) && (bVar2 = OneOrMore(in_stack_ffffffffffffff98,(State *)0x3b6f7f), bVar2))
             && ((bVar2 = ParseOneCharToken(state_00,in_stack_ffffffffffffffc7), bVar2 &&
                 (bVar2 = ParseBaseUnresolvedName(in_stack_ffffffffffffffd8), bVar2)))) {
            local_1 = 1;
          }
          else {
            *(State **)&local_10->parse_state = state_00;
            *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar1;
            bVar2 = ParseTwoCharToken(state_00,(char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                                in_stack_ffffffffffffffc0));
            if (((bVar2) &&
                (bVar2 = ParseTwoCharToken(state_00,(char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                                     in_stack_ffffffffffffffc0)),
                bVar2)) &&
               ((bVar2 = ParseSimpleId((State *)CONCAT17(in_stack_ffffffffffffffa7,
                                                         CONCAT16(in_stack_ffffffffffffffa6,
                                                                  in_stack_ffffffffffffffa0))),
                bVar2 && (bVar2 = ParseSimpleId((State *)CONCAT17(bVar2,CONCAT16(
                                                  in_stack_ffffffffffffffa6,
                                                  in_stack_ffffffffffffffa0))), bVar2)))) {
              local_1 = 1;
            }
            else {
              *(State **)&local_10->parse_state = state_00;
              *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar1;
              local_1 = 0;
            }
          }
        }
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_18);
  return (bool)(local_1 & 1);
}

Assistant:

static bool ParseUnresolvedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;
  if (Optional(ParseTwoCharToken(state, "gs")) &&
      ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseUnresolvedType(state) &&
      ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseOneCharToken(state, 'N') &&
      ParseUnresolvedType(state) &&
      OneOrMore(ParseUnresolvedQualifierLevel, state) &&
      ParseOneCharToken(state, 'E') && ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (Optional(ParseTwoCharToken(state, "gs")) &&
      ParseTwoCharToken(state, "sr") &&
      OneOrMore(ParseUnresolvedQualifierLevel, state) &&
      ParseOneCharToken(state, 'E') && ParseBaseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseTwoCharToken(state, "St") &&
      ParseSimpleId(state) && ParseSimpleId(state)) {
    return true;
  }
  state->parse_state = copy;

  return false;
}